

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

bool ClipperLib::SlopesEqual(IntPoint pt1,IntPoint pt2,IntPoint pt3,bool UseFullInt64Range)

{
  long lVar1;
  long lVar2;
  long lhs;
  bool bVar3;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  
  lVar1 = pt2.Y;
  lVar2 = pt2.X;
  lhs = pt1.Y - lVar1;
  if (UseFullInt64Range) {
    Int128Mul((ClipperLib *)&local_38,lhs,lVar2 - pt3.X);
    Int128Mul((ClipperLib *)&local_48,pt1.X - lVar2,lVar1 - pt3.Y);
    bVar3 = local_48 == local_38 && local_30 == local_40;
  }
  else {
    bVar3 = (lVar2 - pt3.X) * lhs - (lVar1 - pt3.Y) * (pt1.X - lVar2) == 0;
  }
  return bVar3;
}

Assistant:

bool SlopesEqual(const IntPoint pt1, const IntPoint pt2,
  const IntPoint pt3, bool UseFullInt64Range)
{
#ifndef use_int32
  if (UseFullInt64Range)
    return Int128Mul(pt1.Y-pt2.Y, pt2.X-pt3.X) == Int128Mul(pt1.X-pt2.X, pt2.Y-pt3.Y);
  else 
#endif
    return (pt1.Y-pt2.Y)*(pt2.X-pt3.X) == (pt1.X-pt2.X)*(pt2.Y-pt3.Y);
}